

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O3

bool __thiscall
CAPSFile::GetStreamGapItem
          (CAPSFile *this,StreamItem *item,uchar *buffer,uint *offset,uint size_of_buffer)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = *offset;
  *offset = uVar6 + 1;
  bVar2 = buffer[uVar6];
  if (bVar2 == 0) {
    bVar1 = false;
  }
  else {
    item->size = 0;
    item->sample_size = '\0';
    item->sample = '\0';
    *(undefined2 *)&item->field_0x6 = 0;
    uVar6 = *offset;
    bVar1 = true;
    if (uVar6 < size_of_buffer) {
      while( true ) {
        uVar5 = 0;
        if (0x1f < bVar2) {
          iVar3 = (uint)(bVar2 >> 5) * 8 + -8;
          uVar5 = 0;
          uVar4 = uVar6;
          do {
            uVar6 = uVar4 + 1;
            *offset = uVar6;
            uVar5 = uVar5 + ((uint)buffer[uVar4] << ((byte)iVar3 & 0x1f));
            iVar3 = iVar3 + -8;
            uVar4 = uVar6;
          } while (iVar3 != -8);
        }
        if ((bVar2 & 0x1f) == 1) {
          item->size = uVar5;
          uVar4 = *offset;
        }
        else {
          if ((bVar2 & 0x1f) != 2) {
            return false;
          }
          uVar4 = uVar6 + 1;
          *offset = uVar4;
          item->sample = buffer[uVar6];
          item->sample_size = (uchar)uVar5;
        }
        uVar6 = uVar4 + 1;
        *offset = uVar6;
        bVar2 = buffer[uVar4];
        if (bVar2 == 0) break;
        if (size_of_buffer <= uVar6) {
          return true;
        }
      }
      return true;
    }
  }
  return bVar1;
}

Assistant:

bool CAPSFile::GetStreamGapItem(CAPSFile::StreamItem* item, unsigned char* buffer, unsigned int& offset,
                                unsigned int size_of_buffer)
{
   // Next stream item
   unsigned char b = buffer[offset++];

   if (b == 0) return false;

   memset(item, 0, sizeof(StreamItem));
   while (b != 0 && offset < size_of_buffer)
   {
      int size = b >> 5;
      int type = b & 0x1F;
      int gap_size = 0;
      for (int j = 0; j < size; j++)
      {
         gap_size += (buffer[offset++] << (8 * (size - (j + 1))));
      }

      if (type == 1)
      {
         item->size = gap_size;
      }
      else if (type == 2)
      {
         item->sample = buffer[offset++];
         item->sample_size = gap_size;
      }
      else return false;

      b = buffer[offset++];
   }
   return true;
}